

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

bool GetVarAddrType(AActor *self,FName *varname,int index,void **addr,PType **type,bool readonly)

{
  PType *pPVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  DObject *p;
  PField *pPVar6;
  PArray *pPVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  void *pvVar8;
  bool bVar9;
  FName local_34;
  PClass *pPVar5;
  
  pPVar5 = (self->super_DThinker).super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
    (self->super_DThinker).super_DObject.Class = pPVar5;
  }
  p = (DObject *)
      PSymbolTable::FindSymbol
                (&(pPVar5->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
                  super_PType.Symbols,&local_34,true);
  pPVar6 = dyn_cast<PField>(p);
  if ((pPVar6 != (PField *)0x0) && ((readonly || ((pPVar6->Flags & 8) == 0)))) {
    pPVar1 = pPVar6->Type;
    *type = pPVar1;
    pvVar8 = (void *)((long)&(self->super_DThinker).super_DObject._vptr_DObject + pPVar6->Offset);
    pPVar7 = dyn_cast<PArray>((DObject *)pPVar1);
    if (pPVar7 == (PArray *)0x0) {
      if (index != 0) {
        return false;
      }
    }
    else {
      *type = pPVar7->ElementType;
      if (pPVar7->ElementCount <= (uint)index) {
        return false;
      }
      pvVar8 = (void *)((long)pvVar8 + (ulong)(index * pPVar7->ElementSize));
    }
    *addr = pvVar8;
    pPVar2 = PInt::RegistrationInfo.MyClass;
    pPVar1 = *type;
    pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
      pPVar5 = (PClass *)CONCAT44(extraout_var_00,iVar4);
      (pPVar1->super_PTypeBase).super_DObject.Class = pPVar5;
    }
    pPVar3 = PFloat::RegistrationInfo.MyClass;
    if (pPVar5 == pPVar2) {
      return true;
    }
    pPVar1 = *type;
    pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
      pPVar5 = (PClass *)CONCAT44(extraout_var_01,iVar4);
      (pPVar1->super_PTypeBase).super_DObject.Class = pPVar5;
    }
    pPVar2 = PName::RegistrationInfo.MyClass;
    bVar9 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar9) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (bVar9) {
      return true;
    }
    if (readonly) {
      pPVar1 = *type;
      pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
      if (pPVar5 == (PClass *)0x0) {
        iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
        pPVar5 = (PClass *)CONCAT44(extraout_var_02,iVar4);
        (pPVar1->super_PTypeBase).super_DObject.Class = pPVar5;
      }
      pPVar3 = PString::RegistrationInfo.MyClass;
      if (pPVar5 == pPVar2) {
        return true;
      }
      pPVar1 = *type;
      pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
      if (pPVar5 == (PClass *)0x0) {
        iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
        pPVar5 = (PClass *)CONCAT44(extraout_var_03,iVar4);
        (pPVar1->super_PTypeBase).super_DObject.Class = pPVar5;
      }
      if (pPVar5 == pPVar3) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool GetVarAddrType(AActor *self, FName varname, int index, void *&addr, PType *&type, bool readonly)
{
	PField *var = dyn_cast<PField>(self->GetClass()->Symbols.FindSymbol(varname, true));
	PArray *arraytype;

	if (var == NULL || (!readonly && (var->Flags & VARF_Native)))
	{
		return false;
	}
	type = var->Type;
	BYTE *baddr = reinterpret_cast<BYTE *>(self) + var->Offset;
	arraytype = dyn_cast<PArray>(type);
	if (arraytype != NULL)
	{
		// unwrap contained type
		type = arraytype->ElementType;
		// offset by index (if in bounds)
		if ((unsigned)index >= arraytype->ElementCount)
		{ // out of bounds
			return false;
		}
		baddr += arraytype->ElementSize * index;
	}
	else if (index != 0)
	{ // ignore attempts to set indexed values on non-arrays
		return false;
	}
	addr = baddr;
	// We don't want Int subclasses like Name or Color to be accessible,
	// but we do want to support Float subclasses like Fixed.
	if (!type->IsA(RUNTIME_CLASS(PInt)) && !type->IsKindOf(RUNTIME_CLASS(PFloat)))
	{
		// For reading, we also support Name and String types.
		if (readonly && (type->IsA(RUNTIME_CLASS(PName)) || type->IsA(RUNTIME_CLASS(PString))))
		{
			return true;
		}
		return false;
	}
	return true;
}